

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O0

int act_disp_nims(nt_opts *opts)

{
  nifti_image *nim_00;
  field_s *fieldp;
  bool local_41;
  uint local_40;
  int local_3c;
  int local_38;
  int fc;
  int filenum;
  int nfields;
  char **sptr;
  field_s *fnim;
  nifti_image *nim;
  nt_opts *opts_local;
  
  if ((opts->flist).len < 1) {
    local_40 = 0x3f;
  }
  else {
    local_40 = (opts->flist).len;
  }
  if (2 < g_debug) {
    fprintf(_stderr,"-d displaying %d fields for %d nifti datasets...\n",(ulong)local_40,
            (ulong)(uint)(opts->infiles).len);
  }
  local_38 = 0;
  while( true ) {
    if ((opts->infiles).len <= local_38) {
      return 0;
    }
    nim_00 = nt_image_read(opts,(opts->infiles).list[local_38],0);
    if (nim_00 == (nifti_image *)0x0) break;
    if (0 < g_debug) {
      fprintf(_stdout,"\nheader file \'%s\', num_fields = %d, fields:\n\n",nim_00->fname,
              (ulong)local_40);
    }
    if ((opts->flist).len < 1) {
      disp_field("all fields:\n",g_nim_fields,nim_00,local_40,(uint)(0 < g_debug));
    }
    else {
      _filenum = (opts->flist).list;
      for (local_3c = 0; local_3c < (opts->flist).len; local_3c = local_3c + 1) {
        fieldp = get_nim_field(*_filenum,(uint)(local_38 == 0));
        if (fieldp != (field_s *)0x0) {
          local_41 = 0 < g_debug && local_3c == 0;
          disp_field((char *)0x0,fieldp,nim_00,1,(uint)local_41);
        }
        _filenum = _filenum + 1;
      }
    }
    nifti_image_free(nim_00);
    local_38 = local_38 + 1;
  }
  return 1;
}

Assistant:

int act_disp_nims( nt_opts * opts )
{
   nifti_image *  nim;
   field_s     *  fnim;
   char        ** sptr;
   int            nfields, filenum, fc;

   /* set the number of fields to display */
   nfields = opts->flist.len > 0 ? opts->flist.len : NT_NIM_NUM_FIELDS;

   if( g_debug > 2 )
      fprintf(stderr,"-d displaying %d fields for %d nifti datasets...\n",
              nfields, opts->infiles.len);

   for( filenum = 0; filenum < opts->infiles.len; filenum++ )
   {
      nim = nt_image_read(opts, opts->infiles.list[filenum], 0);
      if( !nim ) return 1;  /* errors are printed from library */

      if( g_debug > 0 )
         fprintf(stdout,"\nheader file '%s', num_fields = %d, fields:\n\n",
                 nim->fname, nfields);

      if( opts->flist.len <= 0 ) /* then display all fields */
         disp_field("all fields:\n", g_nim_fields, nim, nfields, g_debug > 0);
      else  /* print only the requested fields... */
      {
         /* must locate each field before printing it */
         sptr = opts->flist.list;
         for( fc = 0; fc < opts->flist.len; fc++ )
         {
            fnim = get_nim_field(*sptr, filenum == 0);
            if( fnim ) disp_field(NULL, fnim, nim, 1, g_debug > 0 && fc == 0);
            sptr++;
         }
      }

      nifti_image_free(nim);
   }

   return 0;
}